

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O2

bool __thiscall
RevocationValues::Decode(RevocationValues *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  size_t *cbUsed_00;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  DecodeResult DVar4;
  size_t sVar5;
  byte bVar6;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  sh.prefixSize = 0;
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.cbUsed._0_1_ = 0;
  sh.cbCurrent = (size_t)cbUsed;
  DVar4 = SequenceHelper::Init((SequenceHelper *)auStack_58,pIn,cbIn,&(this->super_DerBase).cbData);
  sVar2 = sh.dataSize;
  if (DVar4 < Success) {
    bVar6 = 6 >> ((byte)DVar4 & 7);
  }
  else {
    lVar1 = *(long *)sh.cbCurrent;
    sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
    cbUsed_00 = &sh.prefixSize;
    bVar3 = DerBase::DecodeSet<CertificateList>(pIn + sVar2 + lVar1,sVar5,cbUsed_00,&this->crlVals);
    sVar2 = sh.dataSize;
    if (bVar3) {
      *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
      sh.prefixSize = 0;
      lVar1 = *(long *)sh.cbCurrent;
      sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      bVar3 = DerBase::DecodeSet<BasicOCSPResponse>
                        (pIn + sVar2 + lVar1,sVar5,cbUsed_00,&this->ocspVals);
      sVar2 = sh.dataSize;
      if (bVar3) {
        *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
        sh.prefixSize = 0;
        lVar1 = *(long *)sh.cbCurrent;
        sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
        bVar6 = OtherRevVals::Decode(&this->otherRevVals,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
        goto LAB_00117e48;
      }
    }
    bVar6 = 0;
  }
LAB_00117e48:
  SequenceHelper::~SequenceHelper((SequenceHelper *)auStack_58);
  return (bool)(bVar6 & 1);
}

Assistant:

bool RevocationValues::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    SequenceHelper sh(cbUsed);

    switch (sh.Init(pIn, cbIn, this->cbData))
    {
    case DecodeResult::Failed:
        return false;
    case DecodeResult::Null:
    case DecodeResult::EmptySequence:
        return true;
    case DecodeResult::Success:
        break;
    }

    if (!DecodeSet(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize(), crlVals))
        return false;

    sh.Update();
    if (!DecodeSet(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize(), ocspVals))
        return false;

    sh.Update();
    if (!otherRevVals.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    return true;
}